

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::flush_phi(CompilerGLSL *this,BlockID from,BlockID to)

{
  anon_class_16_2_20c2b6d0_for__M_pred __pred;
  IVariant *pIVar1;
  SPIRVariable *pSVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  SPIRVariable *pSVar6;
  Phi *pPVar7;
  Phi *pPVar8;
  size_type sVar9;
  SPIRType *type;
  ID *this_00;
  char (*in_R8) [6];
  string local_158;
  string local_138;
  uint32_t local_114;
  undefined1 local_110 [8];
  string rhs;
  string lhs;
  uint32_t local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  SPIRVariable *local_98;
  BlockID *local_90;
  undefined1 local_81;
  SPIRVariable *pSStack_80;
  bool need_saved_temporary;
  SPIRVariable *var;
  Phi *phi;
  SPIRVariable *local_60;
  Phi *itr;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  temporary_phi_variables;
  SPIRBlock *child;
  CompilerGLSL *this_local;
  BlockID to_local;
  BlockID from_local;
  
  this_local._0_4_ = to.id;
  this_local._4_4_ = from.id;
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
  temporary_phi_variables._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar4);
  uVar4 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)
                     &((SPIRBlock *)temporary_phi_variables._M_h._M_single_bucket)->
                      ignore_phi_from_block);
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  if (uVar4 != uVar5) {
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&itr);
    for (local_60 = (SPIRVariable *)
                    ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRBlock::Phi,8ul>>
                              ((SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *)
                               (temporary_phi_variables._M_h._M_single_bucket + 0x18));
        pSVar2 = local_60,
        pSVar6 = (SPIRVariable *)
                 ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRBlock::Phi,8ul>>
                           ((SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *)
                            (temporary_phi_variables._M_h._M_single_bucket + 0x18)),
        pSVar2 != pSVar6; local_60 = (SPIRVariable *)&(local_60->super_IVariant).field_0xc) {
      var = local_60;
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)((long)&(local_60->super_IVariant)._vptr_IVariant + 4));
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
      if (uVar4 == uVar5) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        pSStack_80 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,uVar4);
        if (((pSStack_80->loop_variable & 1U) == 0) ||
           ((pSStack_80->loop_variable_enable & 1U) != 0)) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
          flush_variable_declaration(this,uVar4);
          pIVar1 = &local_60->super_IVariant;
          pPVar7 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRBlock::Phi,8ul>>
                             ((SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *)
                              (temporary_phi_variables._M_h._M_single_bucket + 0x18));
          local_98 = var;
          local_90 = (BlockID *)((long)&this_local + 4);
          __pred.from = local_90;
          __pred.phi = (Phi *)var;
          pPVar7 = ::std::
                   find_if<spirv_cross::SPIRBlock::Phi*,spirv_cross::CompilerGLSL::flush_phi(spirv_cross::TypedID<(spirv_cross::Types)6>,spirv_cross::TypedID<(spirv_cross::Types)6>)::__0>
                             ((Phi *)&pIVar1->field_0xc,pPVar7,__pred);
          pPVar8 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRBlock::Phi,8ul>>
                             ((SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *)
                              (temporary_phi_variables._M_h._M_single_bucket + 0x18));
          local_81 = pPVar7 != pPVar8;
          if ((bool)local_81) {
            if ((pSStack_80->allocate_temporary_copy & 1U) == 0) {
              pSStack_80->allocate_temporary_copy = true;
              Compiler::force_recompile(&this->super_Compiler);
            }
            this_00 = &(var->super_IVariant).self;
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)this_00);
            (*(this->super_Compiler)._vptr_Compiler[6])(&local_b8,this,(ulong)uVar4,1);
            in_R8 = (char (*) [6])0x6766c4;
            statement<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)2>&,char_const(&)[6],char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (this,(char (*) [2])0x66305e,(TypedID<(spirv_cross::Types)2> *)this_00,
                       (char (*) [6])0x673a3c,(char (*) [4])0x6766c4,&local_b8,
                       (char (*) [2])0x6815db);
            ::std::__cxx11::string::~string((string *)&local_b8);
            local_bc = TypedID::operator_cast_to_unsigned_int
                                 ((TypedID *)&(var->super_IVariant).self);
            ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&itr,&local_bc);
          }
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
          to_expression_abi_cxx11_((string *)((long)&rhs.field_2 + 8),this,uVar4,true);
          ::std::__cxx11::string::string((string *)local_110);
          local_114 = TypedID::operator_cast_to_unsigned_int((TypedID *)var);
          sVar9 = ::std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&itr,&local_114);
          if (sVar9 == 0) {
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)var);
            to_pointer_expression_abi_cxx11_(&local_158,this,uVar4,true);
            ::std::__cxx11::string::operator=((string *)local_110,(string *)&local_158);
            ::std::__cxx11::string::~string((string *)&local_158);
          }
          else {
            join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[6]>
                      (&local_138,(spirv_cross *)0x66305e,(char (*) [2])var,
                       (TypedID<(spirv_cross::Types)0> *)0x673a3c,in_R8);
            ::std::__cxx11::string::operator=((string *)local_110,(string *)&local_138);
            ::std::__cxx11::string::~string((string *)&local_138);
          }
          uVar4 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(pSStack_80->super_IVariant).field_0xc);
          type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar4);
          bVar3 = optimize_read_modify_write
                            (this,type,(string *)((long)&rhs.field_2 + 8),(string *)local_110);
          if (!bVar3) {
            in_R8 = (char (*) [6])0x6815db;
            statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&rhs.field_2 + 8),(char (*) [4])0x6766c4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110,(char (*) [2])0x6815db);
          }
          ::std::__cxx11::string::~string((string *)local_110);
          ::std::__cxx11::string::~string((string *)(rhs.field_2._M_local_buf + 8));
        }
        else {
          (pSStack_80->static_expression).id = *(uint32_t *)&(var->super_IVariant)._vptr_IVariant;
        }
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        Compiler::register_write(&this->super_Compiler,uVar4);
      }
    }
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&itr);
  }
  return;
}

Assistant:

void CompilerGLSL::flush_phi(BlockID from, BlockID to)
{
	auto &child = get<SPIRBlock>(to);
	if (child.ignore_phi_from_block == from)
		return;

	unordered_set<uint32_t> temporary_phi_variables;

	for (auto itr = begin(child.phi_variables); itr != end(child.phi_variables); ++itr)
	{
		auto &phi = *itr;

		if (phi.parent == from)
		{
			auto &var = get<SPIRVariable>(phi.function_variable);

			// A Phi variable might be a loop variable, so flush to static expression.
			if (var.loop_variable && !var.loop_variable_enable)
				var.static_expression = phi.local_variable;
			else
			{
				flush_variable_declaration(phi.function_variable);

				// Check if we are going to write to a Phi variable that another statement will read from
				// as part of another Phi node in our target block.
				// For this case, we will need to copy phi.function_variable to a temporary, and use that for future reads.
				// This is judged to be extremely rare, so deal with it here using a simple, but suboptimal algorithm.
				bool need_saved_temporary =
				    find_if(itr + 1, end(child.phi_variables), [&](const SPIRBlock::Phi &future_phi) -> bool {
					    return future_phi.local_variable == ID(phi.function_variable) && future_phi.parent == from;
				    }) != end(child.phi_variables);

				if (need_saved_temporary)
				{
					// Need to make sure we declare the phi variable with a copy at the right scope.
					// We cannot safely declare a temporary here since we might be inside a continue block.
					if (!var.allocate_temporary_copy)
					{
						var.allocate_temporary_copy = true;
						force_recompile();
					}
					statement("_", phi.function_variable, "_copy", " = ", to_name(phi.function_variable), ";");
					temporary_phi_variables.insert(phi.function_variable);
				}

				// This might be called in continue block, so make sure we
				// use this to emit ESSL 1.0 compliant increments/decrements.
				auto lhs = to_expression(phi.function_variable);

				string rhs;
				if (temporary_phi_variables.count(phi.local_variable))
					rhs = join("_", phi.local_variable, "_copy");
				else
					rhs = to_pointer_expression(phi.local_variable);

				if (!optimize_read_modify_write(get<SPIRType>(var.basetype), lhs, rhs))
					statement(lhs, " = ", rhs, ";");
			}

			register_write(phi.function_variable);
		}
	}
}